

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

ssize_t parse_ncname(char *ncname)

{
  LY_ERR LVar1;
  size_t sVar2;
  char *in_RDI;
  uint32_t uc;
  size_t size;
  uint local_34;
  size_t local_30;
  char *local_28;
  
  local_28 = in_RDI;
  LVar1 = ly_getutf8(&local_28,&local_34,&local_30);
  if (LVar1 == LY_SUCCESS) {
    if (((local_34 != 0x5f) && (0x19 < (local_34 & 0xffffffdf) - 0x41)) &&
       (local_34 == 0x37e || 0x1c8f < local_34 - 0x370)) {
      if ((((0x20d < local_34 - 0xfdf0) && (0x4cf < local_34 - 0xf900)) &&
          ((0xa7fe < local_34 - 0x3001 &&
           ((0x3ef < local_34 - 0x2c00 && (0x11f < local_34 - 0x2070)))))) &&
         (((local_34 & 0xfffffffe) != 0x200c &&
          (0x23f < local_34 - 0xc0 || (local_34 & 0xffffffdf) == 0xd7)))) {
        if (local_34 - 0xf0000 < 0xfff20000) {
          return 0;
        }
        goto LAB_001a83b4;
      }
    }
    if (local_34 != 0x3a) {
LAB_001a83b4:
      if (*local_28 == '\0') {
        return local_30;
      }
      sVar2 = local_30;
      do {
        LVar1 = ly_getutf8(&local_28,&local_34,&local_30);
        if (LVar1 != LY_SUCCESS) {
          return -sVar2;
        }
        if (local_34 - 0x61 < 0x1a) {
LAB_001a83f8:
          if (local_34 == 0x3a) {
            return sVar2;
          }
        }
        else if ((local_34 != 0x2d) && (local_34 != 0x5f)) {
          if (9 < local_34 - 0x30 && 0x19 < local_34 - 0x41) {
            if ((local_34 == 0x2e) || (local_34 == 0xb7)) goto LAB_001a840c;
            if (local_34 == 0x37e || 0x1c8f < local_34 - 0x370) {
              if ((((((0x20d < local_34 - 0xfdf0) && (0x4cf < local_34 - 0xf900)) &&
                    (0xa7fe < local_34 - 0x3001)) &&
                   ((0x3ef < local_34 - 0x2c00 && (1 < local_34 - 0x203f)))) &&
                  ((0x11f < local_34 - 0x2070 &&
                   ((0x6f < local_34 - 0x300 && ((local_34 & 0xfffffffe) != 0x200c)))))) &&
                 (0x23f < local_34 - 0xc0 || (local_34 & 0xffffffdf) == 0xd7)) {
                if (0xdffff < local_34 - 0x10000) {
                  return sVar2;
                }
                goto LAB_001a840c;
              }
            }
          }
          goto LAB_001a83f8;
        }
LAB_001a840c:
        sVar2 = sVar2 + local_30;
        if (*local_28 == '\0') {
          return sVar2;
        }
      } while( true );
    }
  }
  return 0;
}

Assistant:

static ssize_t
parse_ncname(const char *ncname)
{
    uint32_t uc;
    size_t size;
    ssize_t len = 0;

    LY_CHECK_RET(ly_getutf8(&ncname, &uc, &size), 0);
    if (!is_xmlqnamestartchar(uc) || (uc == ':')) {
        return len;
    }

    do {
        len += size;
        if (!*ncname) {
            break;
        }
        LY_CHECK_RET(ly_getutf8(&ncname, &uc, &size), -len);
    } while (is_xmlqnamechar(uc) && (uc != ':'));

    return len;
}